

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave_header.cpp
# Opt level: O2

void cinemo::wh::getFmtFromFileHandle(WaveHeader *wh,ifstream *file,header_pos dp)

{
  bool bVar1;
  long lVar2;
  uint16_t *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char buff [256];
  
  std::istream::seekg((long)file,dp.second);
  std::istream::read((char *)file,(long)buff);
  wh->FormatSize = buff._0_4_ & 0xff000000 | (int)buff[2] << 0x10 | (int)buff[1] << 8 | (int)buff[0]
  ;
  std::istream::read((char *)file,(long)&wh->FormatAudioType);
  std::istream::read((char *)file,(long)&wh->NumberOfChannels);
  std::istream::read((char *)file,(long)&wh->SampleRate);
  std::istream::read((char *)file,(long)&wh->ByteRate);
  std::istream::read((char *)file,(long)&wh->BlockAlign);
  std::istream::read((char *)file,(long)&wh->BitsPerSample);
  lVar2 = std::istream::tellg();
  lVar2 = (((long)dp >> 0x20) - lVar2) + (ulong)wh->FormatSize;
  if (lVar2 == -2) {
    puVar3 = &wh->ExtensionSize;
  }
  else {
    if (lVar2 == -4) goto LAB_00106268;
    if (wh->ExtensionSize == 0) {
      std::istream::ignore((long)file);
      goto LAB_00106268;
    }
    if (wh->ExtensionSize != 0x16) {
      std::bitset<8UL>::set(&wh->WarningFlags,1,true);
      goto LAB_00106268;
    }
    std::istream::read((char *)file,(long)&wh->ValidBitsPerSample);
    std::istream::read((char *)file,(long)&wh->ChannelMask);
    puVar3 = (uint16_t *)wh->SubFormat;
  }
  std::istream::read((char *)file,(long)puVar3);
LAB_00106268:
  std::istream::read((char *)file,(long)buff);
  if (wh->HasFact == false) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    local_158.field_2._M_local_buf[0] = buff[0];
    local_158.field_2._M_local_buf[1] = buff[1];
    local_158.field_2._M_local_buf[2] = buff[2];
    local_158.field_2._M_local_buf[3] = buff[3];
    local_158._M_string_length = 4;
    local_158.field_2._M_local_buf[4] = '\0';
    bVar1 = std::operator!=(&local_158,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            WaveDataString_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
    if (bVar1) {
      std::bitset<8UL>::set(&wh->WarningFlags,1,true);
    }
  }
  return;
}

Assistant:

void getFmtFromFileHandle(WaveHeader* wh, std::ifstream& file,
                                  header_pos dp) {
            file.seekg(dp.second, std::ios::beg);
            char buff[WaveBufferSize];
            //get format size
            file.read(&buff[0], 4);
            wh->FormatSize = convert4CharTo16_BigEndian(&buff[0]);
            file.read(reinterpret_cast<char*>(&wh->FormatAudioType),
                      sizeof(wh->FormatAudioType));
            file.read(reinterpret_cast<char*>(&wh->NumberOfChannels),
                      sizeof(wh->NumberOfChannels));
            file.read(reinterpret_cast<char*>(&wh->SampleRate),
                      sizeof(wh->SampleRate));
            file.read(reinterpret_cast<char*>(&wh->ByteRate),
                      sizeof(wh->ByteRate));
            file.read(reinterpret_cast<char*>(&wh->BlockAlign),
                      sizeof(wh->BlockAlign));
            file.read(reinterpret_cast<char*>(&wh->BitsPerSample),
                      sizeof(wh->BitsPerSample));

            //check if file is standard fmt with 16 fmt bytes or extended!
            long readSoFar = (static_cast<long>(file.tellg()) - dp.second -
                              4); //4 is for "fmt "
            long leftToRead = wh->FormatSize - readSoFar;

            if (leftToRead == 0) { //Standard FMT read is complete
                //double check, if file is standard, now it should have reach to "data"
                file.read(&buff[0], 4);
                if (!wh->HasFact &&
                    string(&buff[0], 4) != WaveDataString) { //update error flag
                    wh->WarningFlags.set(
                            static_cast<int>(WARNING_NoneStandardExtension), 1);
                }
                return;
            } else if (leftToRead == 2) { //its fmt with 18 bytes
                file.read(reinterpret_cast<char*>(&wh->ExtensionSize),
                          sizeof(wh->ExtensionSize));
                file.read(&buff[0], 4);
                if (!wh->HasFact &&
                    string(&buff[0], 4) != WaveDataString) { //update error flag
                    wh->WarningFlags.set(
                            static_cast<int>(WARNING_NoneStandardExtension), 1);
                }
                return;
            }

            //standard extension sizes are 0 or 22 (0 is set by default in the struct)
            if (wh->ExtensionSize != 0 && wh->ExtensionSize != WaveStandartdExtSize) {
                wh->WarningFlags.set(
                        static_cast<int>(WARNING_NoneStandardExtension), 1);				
            } else if (wh->ExtensionSize == WaveStandartdExtSize) {
				file.read(reinterpret_cast<char*>(&wh->ValidBitsPerSample),
					sizeof(wh->ValidBitsPerSample)); //2
				file.read(reinterpret_cast<char*>(&wh->ChannelMask),
					sizeof(wh->ChannelMask)); //4
				file.read(reinterpret_cast<char*>(&wh->SubFormat[0]),
					sizeof(wh->SubFormat[0]) *
					(wh->ExtensionSize - 6)); //16 byte, [6 = 2 vbps, 4 cm]
			} else { //skip nonstandard extension to reach data...				
				file.ignore(wh->ExtensionSize);
			}
            //by reaching here the next 4 bytes should be "fact" (if it is available)
            // or "data" (other possibilities might exist!!!!)
            file.read(&buff[0], 4);
            if (!wh->HasFact &&
                string(&buff[0], 4) != WaveDataString) { //update error flag
                wh->WarningFlags.set(
                        static_cast<int>(WARNING_NoneStandardExtension), 1);
            }
        }